

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

_ElementType * __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Kernel::Substitution>,_Lib::IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>_>
::next(CatIterator<Lib::VirtualIterator<Kernel::Substitution>,_Lib::IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>_>
       *this)

{
  byte *in_RSI;
  CatIterator<Lib::VirtualIterator<Kernel::Substitution>,_Lib::IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>_>
  *in_RDI;
  IterTraits<Inferences::Instantiation::AllSubstitutionsIterator> *in_stack_00000028;
  CatIterator<Lib::VirtualIterator<Kernel::Substitution>,_Lib::IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>_>
  *this_00;
  
  this_00 = in_RDI;
  hasNext(in_RDI);
  if ((*in_RSI & 1) == 0) {
    IterTraits<Inferences::Instantiation::AllSubstitutionsIterator>::next(in_stack_00000028);
  }
  else {
    VirtualIterator<Kernel::Substitution>::next((VirtualIterator<Kernel::Substitution> *)this_00);
  }
  return (_ElementType *)in_RDI;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }